

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O3

optional<Patch::Change> * __thiscall
Patch::get_change_starting_before_position<Patch::OldCoordinates>
          (optional<Patch::Change> *__return_storage_ptr__,Patch *this,Point target)

{
  int iVar1;
  _Head_base<0UL,_Text_*,_false> _Var2;
  _Head_base<0UL,_Text_*,_false> _Var3;
  optional<Patch::Change> *poVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  Node *pNVar8;
  Point PVar9;
  Node *pNVar10;
  Node *pNVar11;
  uint32_t uVar12;
  Point node_old_start;
  Point node_new_start;
  PositionStackEntry left_ancestor_info;
  PositionStackEntry found_node_left_ancestor_info;
  Point local_a8;
  optional<Patch::Change> *local_a0;
  Point local_98;
  Point local_90;
  Point PStack_88;
  undefined8 local_80;
  Point local_78;
  Point PStack_70;
  undefined8 local_68;
  Point local_58;
  Point local_50;
  Point local_48;
  Point local_40;
  Point local_38;
  
  pNVar8 = this->root;
  local_a0 = __return_storage_ptr__;
  local_38 = target;
  Point::Point(&local_90);
  Point::Point(&PStack_88);
  local_80 = 0;
  Point::Point(&local_78);
  Point::Point(&PStack_70);
  local_68 = 0;
  if (pNVar8 != (Node *)0x0) {
    pNVar11 = (Node *)0x0;
    do {
      local_a8 = Point::traverse(&local_90,&pNVar8->old_distance_from_left_ancestor);
      local_98 = Point::traverse(&PStack_88,&pNVar8->new_distance_from_left_ancestor);
      local_40 = local_a8;
      bVar5 = Point::operator<=(&local_40,&local_38);
      if (bVar5) {
        local_68 = local_80;
        local_78 = local_90;
        PStack_70 = PStack_88;
        pNVar11 = pNVar8;
        if (pNVar8->right == (Node *)0x0) break;
        local_90 = Point::traverse(&local_a8,&pNVar8->old_extent);
        PStack_88 = Point::traverse(&local_98,&pNVar8->new_extent);
        pNVar10 = pNVar8->left;
        if (pNVar10 == (Node *)0x0) {
          uVar12 = 0;
        }
        else {
          uVar12 = pNVar10->old_subtree_text_size;
        }
        _Var2._M_head_impl =
             (pNVar8->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
             super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
             super__Head_base<0UL,_Text_*,_false>._M_head_impl;
        if (_Var2._M_head_impl == (Text *)0x0) {
          uVar6 = pNVar8->old_text_size_;
        }
        else {
          uVar6 = Text::size(_Var2._M_head_impl);
          pNVar10 = pNVar8->left;
        }
        iVar1 = (int)local_80 + uVar6 + uVar12;
        uVar6 = 0;
        uVar12 = 0;
        if (pNVar10 != (Node *)0x0) {
          uVar12 = pNVar10->new_subtree_text_size;
        }
        _Var2._M_head_impl =
             (pNVar8->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
             super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
             super__Head_base<0UL,_Text_*,_false>._M_head_impl;
        local_80._0_4_ = iVar1;
        if (_Var2._M_head_impl != (Text *)0x0) {
          uVar6 = Text::size(_Var2._M_head_impl);
        }
        local_80 = CONCAT44(local_80._4_4_ + uVar6 + uVar12,(int)local_80);
        pNVar8 = pNVar8->right;
      }
      else {
        pNVar8 = pNVar8->left;
        if (pNVar8 == (Node *)0x0) break;
      }
    } while (pNVar8 != (Node *)0x0);
    if (pNVar11 != (Node *)0x0) {
      local_a8 = Point::traverse(&local_78,&pNVar11->old_distance_from_left_ancestor);
      local_98 = Point::traverse(&PStack_70,&pNVar11->new_distance_from_left_ancestor);
      local_48 = local_a8;
      local_50 = Point::traverse(&local_a8,&pNVar11->old_extent);
      local_58 = local_98;
      PVar9 = Point::traverse(&local_98,&pNVar11->new_extent);
      pNVar8 = pNVar11->left;
      _Var2._M_head_impl =
           (pNVar11->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
           super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
           super__Head_base<0UL,_Text_*,_false>._M_head_impl;
      if (pNVar8 == (Node *)0x0) {
        uVar12 = 0;
        uVar6 = (uint32_t)local_68;
      }
      else {
        uVar12 = pNVar8->new_subtree_text_size;
        uVar6 = (uint32_t)local_68 + pNVar8->old_subtree_text_size;
      }
      uVar12 = local_68._4_4_ + uVar12;
      _Var3._M_head_impl =
           (pNVar11->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
           super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
           super__Head_base<0UL,_Text_*,_false>._M_head_impl;
      if (_Var2._M_head_impl == (Text *)0x0) {
        uVar7 = pNVar11->old_text_size_;
      }
      else {
        uVar7 = Text::size(_Var2._M_head_impl);
      }
      (local_a0->value).old_start = local_48;
      (local_a0->value).old_end = local_50;
      (local_a0->value).new_start = local_58;
      (local_a0->value).new_end = PVar9;
      (local_a0->value).old_text = _Var2._M_head_impl;
      (local_a0->value).new_text = _Var3._M_head_impl;
      (local_a0->value).preceding_old_text_size = uVar6;
      (local_a0->value).preceding_new_text_size = uVar12;
      (local_a0->value).old_text_size = uVar7;
      local_a0->is_some = true;
      return local_a0;
    }
  }
  poVar4 = local_a0;
  optional<Patch::Change>::optional(local_a0);
  return poVar4;
}

Assistant:

optional<Patch::Change> Patch::get_change_starting_before_position(Point target) const {
  const Node *found_node = nullptr;
  const Node *node = root;
  Patch::PositionStackEntry left_ancestor_info;
  Patch::PositionStackEntry found_node_left_ancestor_info;

  while (node) {
    Point node_old_start = left_ancestor_info.old_end.traverse(node->old_distance_from_left_ancestor);
    Point node_new_start = left_ancestor_info.new_end.traverse(node->new_distance_from_left_ancestor);
    if (CoordinateSpace::choose(node_old_start, node_new_start) <= target) {
      found_node = node;
      found_node_left_ancestor_info = left_ancestor_info;
      if (node->right) {
        left_ancestor_info.old_end = node_old_start.traverse(node->old_extent);
        left_ancestor_info.new_end = node_new_start.traverse(node->new_extent);
        left_ancestor_info.total_old_text_size += node->left_subtree_old_text_size() + node->old_text_size();
        left_ancestor_info.total_new_text_size += node->left_subtree_new_text_size() + node->new_text_size();
        node = node->right;
      } else {
        break;
      }
    } else {
      if (node->left) {
        node = node->left;
      } else {
        break;
      }
    }
  }

  if (found_node) {
    Point old_start = found_node_left_ancestor_info.old_end.traverse(found_node->old_distance_from_left_ancestor);
    Point new_start = found_node_left_ancestor_info.new_end.traverse(found_node->new_distance_from_left_ancestor);

    return Change{
      old_start, old_start.traverse(found_node->old_extent),
      new_start, new_start.traverse(found_node->new_extent),
      found_node->old_text.get(),
      found_node->new_text.get(),
      found_node_left_ancestor_info.total_old_text_size + found_node->left_subtree_old_text_size(),
      found_node_left_ancestor_info.total_new_text_size + found_node->left_subtree_new_text_size(),
      found_node->old_text_size()
    };
  } else {
    return optional<Change>{};
  }
}